

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

bool __thiscall
QDockWidgetPrivate::mouseDoubleClickEvent(QDockWidgetPrivate *this,QMouseEvent *event)

{
  bool bVar1;
  char cVar2;
  QDockWidgetLayout *this_00;
  long in_FS_OFFSET;
  QPointF QVar3;
  QPointF local_50;
  QPoint local_40;
  QPoint local_38;
  undefined8 uStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QtPrivate::qobject_cast_helper<QDockWidgetLayout*,QObject>
                      (&((this->super_QWidgetPrivate).layout)->super_QObject);
  bVar1 = QDockWidgetLayout::nativeWindowDeco(this_00);
  if (!bVar1) {
    local_38.xp.m_i = (this_00->_titleArea).x1.m_i;
    local_38.yp.m_i = (this_00->_titleArea).y1.m_i;
    uStack_30._0_4_ = (this_00->_titleArea).x2;
    uStack_30._4_4_ = (this_00->_titleArea).y2;
    if (*(int *)(event + 0x40) == 1) {
      QVar3 = QSinglePointEvent::position((QSinglePointEvent *)event);
      local_50.yp = QVar3.yp;
      local_50.xp = QVar3.xp;
      local_40 = QPointF::toPoint(&local_50);
      cVar2 = QRect::contains(&local_38,SUB81(&local_40,0));
      if ((cVar2 != '\0') &&
         (((this->features).super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
           super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 4) != 0)) {
        toggleTopLevel(this);
        bVar1 = true;
        goto LAB_003d64ef;
      }
    }
  }
  bVar1 = false;
LAB_003d64ef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockWidgetPrivate::mouseDoubleClickEvent(QMouseEvent *event)
{
    QDockWidgetLayout *dwLayout = qobject_cast<QDockWidgetLayout*>(layout);

    if (!dwLayout->nativeWindowDeco()) {
        QRect titleArea = dwLayout->titleArea();

        if (event->button() == Qt::LeftButton && titleArea.contains(event->position().toPoint()) &&
            hasFeature(this, QDockWidget::DockWidgetFloatable)) {
            toggleTopLevel();
            return true;
        }
    }
    return false;
}